

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ineg(ExecutionEngine *this)

{
  undefined1 auVar1 [16];
  VMStack *this_00;
  Frame *this_01;
  Value VVar2;
  undefined1 local_30 [8];
  Value value_1;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  local_30._4_4_ = VVar2.type;
  if (local_30._4_4_ == INT) {
    stack0xffffffffffffffd4 = VVar2._4_12_;
    local_30._0_4_ = 4;
    auVar1 = _local_30;
    value_1.printType = VVar2.data._0_4_;
    value_1.type = VVar2.data._4_4_;
    local_30 = auVar1._0_8_;
    value_1.printType = -value_1.printType;
    VVar2.data = (anon_union_8_10_52016fac_for_data)value_1._0_8_;
    VVar2.printType = local_30._0_4_;
    VVar2.type = local_30._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x912,"void ExecutionEngine::i_ineg()");
}

Assistant:

void ExecutionEngine::i_ineg() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value_1 = topFrame->popTopOfOperandStack();
    assert(value_1.type == ValueType::INT);

    value_1.printType = ValueType::INT;
	value_1.data.intValue = -value_1.data.intValue;
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}